

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O1

int count_bytes(uint32_t integer)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if (integer != 0) {
    uVar4 = (ulong)integer;
    do {
      iVar3 = iVar3 + 1;
      uVar2 = uVar4 >> 8;
      bVar1 = 0xff < integer;
      uVar4 = uVar4 >> 8;
      integer = (uint)uVar2;
    } while (bVar1);
  }
  return iVar3;
}

Assistant:

int count_bytes(uint32_t integer) {
    int bytes = 0;
    while (integer > 0) {
        integer >>= 8;
        bytes++;
    }
    return bytes;
}